

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPathCommand.cxx
# Opt level: O0

string * __thiscall
cmFindPathCommand::FindHeaderInFramework
          (string *__return_storage_ptr__,cmFindPathCommand *this,string *file,string *dir)

{
  bool bVar1;
  long lVar2;
  ulong uVar3;
  char *filename;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  reference in_relative;
  allocator local_1c1;
  string local_1c0;
  undefined1 local_199;
  undefined1 local_198 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  Glob globIt;
  string glob;
  string local_100 [8];
  string intPath;
  string fpath;
  string local_90 [32];
  long local_70;
  size_type pos;
  string frameWorkName;
  string fileName;
  string *dir_local;
  string *file_local;
  cmFindPathCommand *this_local;
  string *fheader;
  
  std::__cxx11::string::string((string *)(frameWorkName.field_2._M_local_buf + 8),(string *)file);
  std::__cxx11::string::string((string *)&pos);
  local_70 = std::__cxx11::string::find(frameWorkName.field_2._M_local_buf + 8,0xaa654a);
  if (local_70 != -1) {
    std::__cxx11::string::substr((ulong)local_90,(ulong)((long)&frameWorkName.field_2 + 8));
    std::__cxx11::string::operator=((string *)(frameWorkName.field_2._M_local_buf + 8),local_90);
    std::__cxx11::string::~string(local_90);
    std::__cxx11::string::operator=((string *)&pos,(string *)file);
    std::__cxx11::string::size();
    std::__cxx11::string::size();
    std::__cxx11::string::substr((ulong)((long)&fpath.field_2 + 8),(ulong)&pos);
    std::__cxx11::string::operator=((string *)&pos,(string *)(fpath.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(fpath.field_2._M_local_buf + 8));
    lVar2 = std::__cxx11::string::find((char *)&pos,0xaa654a);
    if (lVar2 != -1) {
      std::__cxx11::string::operator=
                ((string *)(frameWorkName.field_2._M_local_buf + 8),(string *)file);
      std::__cxx11::string::operator=((string *)&pos,"");
    }
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      std::__cxx11::string::string((string *)(intPath.field_2._M_local_buf + 8),(string *)dir);
      std::__cxx11::string::operator+=((string *)(intPath.field_2._M_local_buf + 8),(string *)&pos);
      std::__cxx11::string::operator+=((string *)(intPath.field_2._M_local_buf + 8),".framework");
      std::__cxx11::string::string(local_100,(string *)(intPath.field_2._M_local_buf + 8));
      std::__cxx11::string::operator+=(local_100,"/Headers/");
      std::__cxx11::string::operator+=(local_100,(string *)(frameWorkName.field_2._M_local_buf + 8))
      ;
      filename = (char *)std::__cxx11::string::c_str();
      bVar1 = cmsys::SystemTools::FileExists(filename);
      if (bVar1) {
        if (((this->super_cmFindBase).field_0x242 & 1) == 0) {
          std::__cxx11::string::string
                    ((string *)__return_storage_ptr__,(string *)(intPath.field_2._M_local_buf + 8));
          bVar1 = true;
        }
        else {
          std::__cxx11::string::string((string *)__return_storage_ptr__,local_100);
          bVar1 = true;
        }
      }
      else {
        bVar1 = false;
      }
      std::__cxx11::string::~string(local_100);
      std::__cxx11::string::~string((string *)(intPath.field_2._M_local_buf + 8));
      if (bVar1) goto LAB_00740c9a;
    }
  }
  std::__cxx11::string::string((string *)&globIt.ListDirs,(string *)dir);
  std::__cxx11::string::operator+=((string *)&globIt.ListDirs,"*.framework/Headers/");
  std::__cxx11::string::operator+=((string *)&globIt.ListDirs,(string *)file);
  cmsys::Glob::Glob((Glob *)&files.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cmsys::Glob::FindFiles
            ((Glob *)&files.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)&globIt.ListDirs,
             (GlobMessages *)0x0);
  __x = cmsys::Glob::GetFiles_abi_cxx11_
                  ((Glob *)&files.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_198,__x);
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_198);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_1c1);
    std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
  }
  else {
    local_199 = 0;
    in_relative = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_198,0);
    cmsys::SystemTools::CollapseFullPath(__return_storage_ptr__,in_relative);
    if (((this->super_cmFindBase).field_0x242 & 1) == 0) {
      cmsys::SystemTools::GetFilenamePath(&local_1c0,__return_storage_ptr__);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_1c0);
      std::__cxx11::string::~string((string *)&local_1c0);
    }
    local_199 = 1;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_198);
  cmsys::Glob::~Glob((Glob *)&files.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)&globIt.ListDirs);
LAB_00740c9a:
  std::__cxx11::string::~string((string *)&pos);
  std::__cxx11::string::~string((string *)(frameWorkName.field_2._M_local_buf + 8));
  return __return_storage_ptr__;
}

Assistant:

std::string
cmFindPathCommand::FindHeaderInFramework(std::string const& file,
                                         std::string const& dir)
{
  std::string fileName = file;
  std::string frameWorkName;
  std::string::size_type pos = fileName.find("/");
  // if there is a / in the name try to find the header as a framework
  // For example bar/foo.h would look for:
  // bar.framework/Headers/foo.h
  if(pos != fileName.npos)
    {
    // remove the name from the slash;
    fileName = fileName.substr(pos+1);
    frameWorkName = file;
    frameWorkName =
      frameWorkName.substr(0, frameWorkName.size()-fileName.size()-1);
    // if the framework has a path in it then just use the filename
    if(frameWorkName.find("/") != frameWorkName.npos)
      {
      fileName = file;
      frameWorkName = "";
      }
    if(!frameWorkName.empty())
      {
      std::string fpath = dir;
      fpath += frameWorkName;
      fpath += ".framework";
      std::string intPath = fpath;
      intPath += "/Headers/";
      intPath += fileName;
      if(cmSystemTools::FileExists(intPath.c_str()))
        {
        if(this->IncludeFileInPath)
          {
          return intPath;
          }
        return fpath;
        }
      }
    }
  // if it is not found yet or not a framework header, then do a glob search
  // for all frameworks in the directory: dir/*.framework/Headers/<file>
  std::string glob = dir;
  glob += "*.framework/Headers/";
  glob += file;
  cmsys::Glob globIt;
  globIt.FindFiles(glob);
  std::vector<std::string> files = globIt.GetFiles();
  if(!files.empty())
    {
    std::string fheader = cmSystemTools::CollapseFullPath(files[0]);
    if(this->IncludeFileInPath)
      {
      return fheader;
      }
    fheader = cmSystemTools::GetFilenamePath(fheader);
    return fheader;
    }
  return "";
}